

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O1

void xatlas::internal::opennl::nlJacobiPreconditionerDestroy(NLJacobiPreconditioner *M)

{
  if (M->diag_inv != (double *)0x0) {
    if (s_free == (undefined *)0x0) {
      (*(code *)s_realloc)(M->diag_inv,0);
    }
    else {
      (*(code *)s_free)();
    }
  }
  M->diag_inv = (double *)0x0;
  return;
}

Assistant:

static void nlJacobiPreconditionerDestroy(NLJacobiPreconditioner* M)
{
	NL_DELETE_ARRAY(M->diag_inv);
}